

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::FixStorageClass::PropagateStorageClass
          (FixStorageClass *this,Instruction *inst,StorageClass storage_class,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *seen)

{
  Op OVar1;
  IRContext *this_00;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  undefined8 *puVar7;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar8;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar9;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> uses;
  undefined8 *local_78;
  undefined8 *puStack_70;
  long local_68;
  Instruction *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  bVar3 = IsPointerResultType(this,inst);
  if (bVar3) {
    bVar3 = IsPointerToStorageClass(this,inst,storage_class);
    OVar1 = inst->opcode_;
    if (!bVar3) {
      if ((int)OVar1 < 0x7c) {
        uVar6 = OVar1 - OpFunctionCall;
        if (uVar6 < 0x1b) {
          if ((0xfdU >> (uVar6 & 0x1f) & 1) != 0) {
            return false;
          }
          if ((0x4000700U >> (uVar6 & 0x1f) & 1) != 0) goto LAB_00570fc0;
        }
LAB_00571064:
        __assert_fail("false && \"Not expecting instruction to have a pointer result type.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                      ,0x6e,
                      "bool spvtools::opt::FixStorageClass::PropagateStorageClass(Instruction *, spv::StorageClass, std::set<uint32_t> *)"
                     );
      }
      if ((int)OVar1 < 0xf5) {
        if (OVar1 == OpBitcast) {
          return false;
        }
        if (OVar1 != OpSelect) goto LAB_00571064;
      }
      else {
        if (OVar1 == OpAllocateNodePayloadsAMDX) {
          return false;
        }
        if (OVar1 != OpPhi) goto LAB_00571064;
      }
LAB_00570fc0:
      FixInstructionStorageClass(this,inst,storage_class,seen);
      return true;
    }
    if (OVar1 == OpPhi) {
      uVar5 = 0;
      if (inst->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      local_58._0_4_ = uVar5;
      pVar8 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::_M_insert_unique<unsigned_int>(&seen->_M_t,(uint *)local_58._M_pod_data);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_00570f77;
    }
    local_78 = (undefined8 *)0x0;
    puStack_70 = (undefined8 *)0x0;
    local_68 = 0;
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    local_58._8_8_ = 0;
    pcStack_40 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp:71:15)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_storage_class.cpp:71:15)>
               ::_M_manager;
    local_60 = inst;
    local_58._M_unused._M_object = &local_78;
    analysis::DefUseManager::ForEachUser
              ((this_00->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               inst,(function<void_(spvtools::opt::Instruction_*)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    puVar2 = puStack_70;
    bVar3 = false;
    for (puVar7 = local_78; puVar7 != puVar2; puVar7 = puVar7 + 1) {
      bVar4 = PropagateStorageClass(this,(Instruction *)*puVar7,storage_class,seen);
      bVar3 = (bool)(bVar3 | bVar4);
    }
    if (local_60->opcode_ == OpPhi) {
      uVar5 = 0;
      if (local_60->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(local_60,(uint)local_60->has_type_id_);
      }
      local_58._0_4_ = uVar5;
      pVar9 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::equal_range(&seen->_M_t,(key_type_conflict *)local_58._M_pod_data);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase_aux(&seen->_M_t,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
    }
    if (local_78 != (undefined8 *)0x0) {
      operator_delete(local_78,local_68 - (long)local_78);
    }
  }
  else {
LAB_00570f77:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool FixStorageClass::PropagateStorageClass(Instruction* inst,
                                            spv::StorageClass storage_class,
                                            std::set<uint32_t>* seen) {
  if (!IsPointerResultType(inst)) {
    return false;
  }

  if (IsPointerToStorageClass(inst, storage_class)) {
    if (inst->opcode() == spv::Op::OpPhi) {
      if (!seen->insert(inst->result_id()).second) {
        return false;
      }
    }

    bool modified = false;
    std::vector<Instruction*> uses;
    get_def_use_mgr()->ForEachUser(
        inst, [&uses](Instruction* use) { uses.push_back(use); });
    for (Instruction* use : uses) {
      modified |= PropagateStorageClass(use, storage_class, seen);
    }

    if (inst->opcode() == spv::Op::OpPhi) {
      seen->erase(inst->result_id());
    }
    return modified;
  }

  switch (inst->opcode()) {
    case spv::Op::OpAccessChain:
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpCopyObject:
    case spv::Op::OpPhi:
    case spv::Op::OpSelect:
      FixInstructionStorageClass(inst, storage_class, seen);
      return true;
    case spv::Op::OpFunctionCall:
      // We cannot be sure of the actual connection between the storage class
      // of the parameter and the storage class of the result, so we should not
      // do anything.  If the result type needs to be fixed, the function call
      // should be inlined.
      return false;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpLoad:
    case spv::Op::OpStore:
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
    case spv::Op::OpVariable:
    case spv::Op::OpBitcast:
    case spv::Op::OpAllocateNodePayloadsAMDX:
      // Nothing to change for these opcode.  The result type is the same
      // regardless of the storage class of the operand.
      return false;
    default:
      assert(false &&
             "Not expecting instruction to have a pointer result type.");
      return false;
  }
}